

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

int __thiscall tetgenmesh::checkconforming(tetgenmesh *this,int flag)

{
  shellface ppdVar1;
  shellface ppdVar2;
  double *pdVar3;
  ulong uVar4;
  shellface ppdVar5;
  double *pdVar6;
  double *pdVar7;
  bool bVar8;
  uint uVar9;
  shellface *pppdVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  tetgenmesh *this_00;
  char *pcVar14;
  int iVar15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  uint local_160;
  int local_15c;
  double local_118 [4];
  double local_f8;
  double dStack_f0;
  double local_e8;
  int indx [4];
  double D;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double local_98;
  double dStack_90;
  double local_88;
  double local_78;
  double local_70;
  double local_68;
  
  local_15c = 0;
  local_160 = 0;
  if ((flag & 1U) != 0) {
    if (this->b->quiet == 0) {
      puts("  Checking conforming property of segments...");
    }
    this_00 = (tetgenmesh *)this->subsegs;
    memorypool::traversalinit((memorypool *)this_00);
    pppdVar10 = shellfacetraverse(this_00,this->subsegs);
    local_160 = 0;
    while (pppdVar10 != (shellface *)0x0) {
      ppdVar1 = pppdVar10[3];
      ppdVar2 = pppdVar10[4];
      pcVar14 = (char *)this;
      dVar17 = distance(this,(double *)ppdVar1,(double *)ppdVar2);
      for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
        local_118[lVar11] = ((double)ppdVar1[lVar11] + (double)ppdVar2[lVar11]) * 0.5;
      }
      uVar16 = (ulong)pppdVar10[9] & 0xfffffffffffffff0;
      if (uVar16 != 0) {
        uVar9 = (uint)pppdVar10[9] & 0xf;
        uVar13 = uVar16;
        do {
          pdVar3 = *(double **)(uVar13 + (long)apexpivot[(int)uVar9] * 8);
          if (pdVar3 != this->dummypoint) {
            pcVar14 = (char *)this;
            dVar18 = distance(this,pdVar3,local_118);
            dVar18 = dVar18 - dVar17 * 0.5;
            if ((dVar18 < 0.0) && (this->b->epsilon < ABS(dVar18) / (dVar17 * 0.5))) {
              pcVar14 = "  !! !! Non-conforming segment: (%d, %d)\n";
              printf("  !! !! Non-conforming segment: (%d, %d)\n",
                     (ulong)*(uint *)((long)ppdVar1 + (long)this->pointmarkindex * 4),
                     (ulong)*(uint *)((long)ppdVar2 + (long)this->pointmarkindex * 4));
              local_160 = local_160 + 1;
              break;
            }
          }
          uVar4 = *(ulong *)(uVar13 + (long)facepivot1[(int)uVar9] * 8);
          uVar13 = uVar4 & 0xfffffffffffffff0;
          uVar9 = facepivot2[(int)uVar9][(uint)uVar4 & 0xf];
        } while (uVar13 != uVar16);
      }
      pppdVar10 = shellfacetraverse((tetgenmesh *)pcVar14,this->subsegs);
    }
    if (local_160 == 0) {
      local_160 = 0;
      if (this->b->quiet == 0) {
        puts("  The segments are conforming Delaunay.");
      }
    }
    else {
      printf("  !! !! %d subsegments are non-conforming.\n",(ulong)local_160);
    }
  }
  if ((flag & 2U) != 0) {
    if (this->b->quiet == 0) {
      puts("  Checking conforming property of subfaces...");
    }
    pcVar14 = (char *)this->subfaces;
    memorypool::traversalinit((memorypool *)pcVar14);
    pppdVar10 = shellfacetraverse((tetgenmesh *)pcVar14,this->subfaces);
    uVar9 = 0;
    local_15c = 0;
    while( true ) {
      if (pppdVar10 == (shellface *)0x0) break;
      ppdVar1 = pppdVar10[3];
      ppdVar2 = pppdVar10[4];
      ppdVar5 = pppdVar10[5];
      pdVar6 = *ppdVar1;
      pdVar7 = ppdVar1[1];
      local_b8 = (double)*ppdVar2 - (double)pdVar6;
      dStack_b0 = (double)ppdVar2[1] - (double)pdVar7;
      pdVar3 = ppdVar1[2];
      local_98 = (double)*ppdVar5 - (double)pdVar6;
      dStack_90 = (double)ppdVar5[1] - (double)pdVar7;
      local_a8 = (double)ppdVar2[2] - (double)pdVar3;
      local_88 = (double)ppdVar5[2] - (double)pdVar3;
      local_68 = local_b8 * dStack_90 - dStack_b0 * local_98;
      local_78 = dStack_b0 * local_88 - dStack_90 * local_a8;
      local_70 = -(local_88 * local_b8 - local_a8 * local_98);
      local_f8 = (local_a8 * local_a8 + local_b8 * local_b8 + dStack_b0 * dStack_b0) * 0.5;
      dStack_f0 = (local_88 * local_88 + local_98 * local_98 + dStack_90 * dStack_90) * 0.5;
      local_e8 = 0.0;
      bVar8 = lu_decmp((tetgenmesh *)pcVar14,(double (*) [4])&local_b8,3,indx,&D,0);
      if (bVar8) {
        lu_solve((tetgenmesh *)pcVar14,(double (*) [4])&local_b8,3,indx,&local_f8,0);
        local_118[0] = (double)pdVar6 + local_f8;
        local_118[1] = (double)pdVar7 + dStack_f0;
        local_118[2] = (double)pdVar3 + local_e8;
        dVar17 = SQRT(local_e8 * local_e8 + local_f8 * local_f8 + dStack_f0 * dStack_f0);
        iVar15 = 2;
        while (bVar8 = iVar15 != 0, iVar15 = iVar15 + -1, bVar8) {
          uVar12 = (uint)pppdVar10[(ulong)uVar9 + 9] & 0xf;
          uVar16 = (ulong)pppdVar10[(ulong)uVar9 + 9] & 0xfffffffffffffff0;
          if (uVar16 != 0) {
            uVar12 = stpivottbl[uVar12][uVar9];
          }
          if ((*(point *)(uVar16 + 0x38) != this->dummypoint) &&
             (pcVar14 = (char *)this,
             dVar18 = distance(this,*(double **)(uVar16 + (long)oppopivot[(int)uVar12] * 8),
                               local_118),
             uVar16 = -(ulong)(ABS(dVar18 - dVar17) / dVar17 < this->b->epsilon),
             (double)(uVar16 & (ulong)dVar17 | ~uVar16 & (ulong)dVar18) < dVar17)) {
            lVar11 = (long)this->pointmarkindex;
            pcVar14 = "  !! !! Non-conforming subface: (%d, %d, %d)\n";
            printf("  !! !! Non-conforming subface: (%d, %d, %d)\n",
                   (ulong)*(uint *)((long)ppdVar1 + lVar11 * 4),
                   (ulong)*(uint *)((long)ppdVar2 + lVar11 * 4),
                   (ulong)*(uint *)((long)ppdVar5 + lVar11 * 4));
            local_15c = local_15c + 1;
            break;
          }
          uVar9 = uVar9 ^ 1;
        }
      }
      pppdVar10 = shellfacetraverse((tetgenmesh *)pcVar14,this->subfaces);
    }
    if (local_15c == 0) {
      local_15c = 0;
      if (this->b->quiet == 0) {
        puts("  The subfaces are conforming Delaunay.");
      }
    }
    else {
      printf("  !! !! %d subfaces are non-conforming.\n");
    }
  }
  return local_15c + local_160;
}

Assistant:

int tetgenmesh::checkconforming(int flag)
{
  triface searchtet, neightet, spintet;
  face shloop;
  face segloop;
  point eorg, edest, eapex, pa, pb, pc;
  REAL cent[3], radius, dist, diff, rd, len;
  bool enq;
  int encsubsegs, encsubfaces;
  int t1ver; 
  int i;

  REAL A[4][4], rhs[4], D;
  int indx[4];
  REAL elen[3];

  encsubsegs = 0;

  if (flag & 1) {
    if (!b->quiet) {
      printf("  Checking conforming property of segments...\n");
    }
    encsubsegs = 0;

    // Run through the list of subsegments, check each one.
    subsegs->traversalinit();
    segloop.sh = shellfacetraverse(subsegs);
    while (segloop.sh != (shellface *) NULL) {
      eorg = (point) segloop.sh[3];
      edest = (point) segloop.sh[4];
      radius = 0.5 * distance(eorg, edest);
      for (i = 0; i < 3; i++) cent[i] = 0.5 * (eorg[i] + edest[i]);

      enq = false;
      sstpivot1(segloop, neightet);
      if (neightet.tet != NULL) {
        spintet = neightet;
        while (1) {
          eapex= apex(spintet);
          if (eapex != dummypoint) {
            dist = distance(eapex, cent);
            diff = dist - radius;
            if (fabs(diff) / radius <= b->epsilon) diff = 0.0; // Rounding.
            if (diff < 0) {
              enq = true; break;
            }
          }
          fnextself(spintet);
          if (spintet.tet == neightet.tet) break;
        }
      }
      if (enq) {
        printf("  !! !! Non-conforming segment: (%d, %d)\n",
               pointmark(eorg), pointmark(edest));
        encsubsegs++;
      }
      segloop.sh = shellfacetraverse(subsegs);
    }

    if (encsubsegs == 0) {
      if (!b->quiet) {
        printf("  The segments are conforming Delaunay.\n");
      }
    } else {
      printf("  !! !! %d subsegments are non-conforming.\n", encsubsegs);
    }
  } // if (flag & 1)

  encsubfaces = 0;

  if (flag & 2) {
    if (!b->quiet) {
      printf("  Checking conforming property of subfaces...\n");
    }

    // Run through the list of subfaces, check each one.
    subfaces->traversalinit();
    shloop.sh = shellfacetraverse(subfaces);
    while (shloop.sh != (shellface *) NULL) {
      pa = (point) shloop.sh[3];
      pb = (point) shloop.sh[4];
      pc = (point) shloop.sh[5];

      // Compute the coefficient matrix A (3x3).
      A[0][0] = pb[0] - pa[0];
      A[0][1] = pb[1] - pa[1];
      A[0][2] = pb[2] - pa[2]; // vector V1 (pa->pb)
      A[1][0] = pc[0] - pa[0];
      A[1][1] = pc[1] - pa[1];
      A[1][2] = pc[2] - pa[2]; // vector V2 (pa->pc)
      cross(A[0], A[1], A[2]); // vector V3 (V1 X V2)

      // Compute the right hand side vector b (3x1).
      elen[0] = dot(A[0], A[0]);
      elen[1] = dot(A[1], A[1]);
      rhs[0] = 0.5 * elen[0];
      rhs[1] = 0.5 * elen[1];
      rhs[2] = 0.0;

      if (lu_decmp(A, 3, indx, &D, 0)) {
        lu_solve(A, 3, indx, rhs, 0);
        cent[0] = pa[0] + rhs[0];
        cent[1] = pa[1] + rhs[1];
        cent[2] = pa[2] + rhs[2];
        rd = sqrt(rhs[0] * rhs[0] + rhs[1] * rhs[1] + rhs[2] * rhs[2]);

        // Check if this subface is encroached.
        for (i = 0; i < 2; i++) {
          stpivot(shloop, searchtet);
          if (!ishulltet(searchtet)) {
            len = distance(oppo(searchtet), cent);
            if ((fabs(len - rd) / rd) < b->epsilon) len = rd; // Rounding.
            if (len < rd) {
              printf("  !! !! Non-conforming subface: (%d, %d, %d)\n",
                     pointmark(pa), pointmark(pb), pointmark(pc));
              encsubfaces++;
              enq = true; break;
            }
          }
          sesymself(shloop);
        }
      }
      shloop.sh = shellfacetraverse(subfaces);
    }

    if (encsubfaces == 0) {
      if (!b->quiet) {
        printf("  The subfaces are conforming Delaunay.\n");
      }
    } else {
      printf("  !! !! %d subfaces are non-conforming.\n", encsubfaces);
    }
  } // if (flag & 2)

  return encsubsegs + encsubfaces;
}